

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompositeDeepScanLine.cpp
# Opt level: O2

void __thiscall Imf_3_4::anon_unknown_0::LineCompositeTask::execute(LineCompositeTask *this)

{
  int iVar1;
  int iVar2;
  Data *pDVar3;
  vector<const_char_*,_std::allocator<const_char_*>_> *pvVar4;
  vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
  *pvVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  int iVar10;
  long lVar11;
  iterator iVar12;
  Iterator IVar13;
  pointer ppcVar14;
  size_t channel;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  Iterator tmp;
  DeepCompositing *pDVar18;
  long lVar19;
  half local_aa;
  long local_a8;
  long local_a0;
  DeepCompositing d;
  vector<const_float_*,_std::allocator<const_float_*>_> inputs;
  vector<float,_std::allocator<float>_> output_pixel;
  
  local_a0 = (long)this->_y;
  iVar1 = this->_start;
  pDVar3 = this->_Data;
  pvVar4 = this->_names;
  pvVar5 = this->_pointers;
  pvVar6 = this->_total_sizes;
  pvVar7 = this->_num_sources;
  std::vector<float,_std::allocator<float>_>::vector
            (&output_pixel,
             (long)(pvVar4->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(pvVar4->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl
                   .super__Vector_impl_data._M_start >> 3,(allocator_type *)&inputs);
  std::vector<const_float_*,_std::allocator<const_float_*>_>::vector
            (&inputs,(long)(pvVar4->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pvVar4->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)
                           ._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)&d);
  DeepCompositing::DeepCompositing(&d);
  pDVar18 = &d;
  if (pDVar3->_comp != (DeepCompositing *)0x0) {
    pDVar18 = pDVar3->_comp;
  }
  iVar10 = (pDVar3->_dataWindow).max.x;
  iVar2 = (pDVar3->_dataWindow).min.x;
  local_a8 = (long)(((iVar10 - iVar2) + 1) * ((int)local_a0 - iVar1));
  for (lVar19 = (long)iVar2; lVar19 <= iVar10; lVar19 = lVar19 + 1) {
    if (pDVar3->_zback == true) {
      lVar11 = 0;
      uVar15 = 0;
      while( true ) {
        ppcVar14 = (pvVar4->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl
                   .super__Vector_impl_data._M_start;
        uVar17 = (long)(pvVar4->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar14;
        if ((ulong)((long)uVar17 >> 3) <= uVar15) break;
        inputs.super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar15] =
             *(float **)
              (*(long *)(*(long *)&(((pvVar5->
                                     super__Vector_base<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                                   )._M_impl.super__Vector_impl_data + lVar11) + local_a8 * 8);
        uVar15 = uVar15 + 1;
        lVar11 = lVar11 + 0x18;
      }
    }
    else {
      *inputs.super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
       super__Vector_impl_data._M_start =
           *(float **)
            (**(long **)&(((pvVar5->
                           super__Vector_base<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                         )._M_impl.super__Vector_impl_data + local_a8 * 8);
      inputs.super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
      super__Vector_impl_data._M_start[1] =
           *(float **)
            (**(long **)&(((pvVar5->
                           super__Vector_base<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                         )._M_impl.super__Vector_impl_data + local_a8 * 8);
      lVar11 = 6;
      uVar15 = 2;
      while( true ) {
        ppcVar14 = (pvVar4->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl
                   .super__Vector_impl_data._M_start;
        uVar17 = (long)(pvVar4->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar14;
        if ((ulong)((long)uVar17 >> 3) <= uVar15) break;
        inputs.super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar15] =
             *(float **)
              (*(long *)(*(long *)&(((pvVar5->
                                     super__Vector_base<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                                   )._M_impl.super__Vector_impl_data + lVar11 * 8) + local_a8 * 8);
        uVar15 = uVar15 + 1;
        lVar11 = lVar11 + 3;
      }
    }
    (*pDVar18->_vptr_DeepCompositing[2])
              (pDVar18,output_pixel.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,
               inputs.super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
               super__Vector_impl_data._M_start,ppcVar14,uVar17 >> 3,
               (ulong)(pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start[local_a8],
               (pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start[local_a8]);
    iVar12._M_node = (_Base_ptr)FrameBuffer::begin(&pDVar3->_outputFrameBuffer);
    lVar11 = 0;
    while( true ) {
      IVar13 = FrameBuffer::end(&pDVar3->_outputFrameBuffer);
      if ((iterator)iVar12._M_node == IVar13._i._M_node) break;
      p_Var8 = iVar12._M_node[9]._M_parent;
      if (iVar12._M_node[9]._M_color == _S_black) {
        lVar16 = (long)iVar12._M_node[9]._M_right * local_a0;
        p_Var9 = iVar12._M_node[9]._M_left;
        Imath_3_2::half::half
                  (&local_aa,
                   output_pixel.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [*(int *)((long)(pDVar3->_bufferMap).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar11)]);
        *(uint16_t *)((long)&p_Var8->_M_color + (long)p_Var9 * lVar19 + lVar16) = local_aa._h;
      }
      else if (iVar12._M_node[9]._M_color == 2) {
        *(float *)((long)&p_Var8->_M_color +
                  (long)iVar12._M_node[9]._M_left * lVar19 +
                  (long)iVar12._M_node[9]._M_right * local_a0) =
             output_pixel.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start
             [*(int *)((long)(pDVar3->_bufferMap).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar11)];
      }
      iVar12._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar12._M_node);
      lVar11 = lVar11 + 4;
    }
    local_a8 = local_a8 + 1;
    iVar10 = (pDVar3->_dataWindow).max.x;
  }
  DeepCompositing::~DeepCompositing(&d);
  std::_Vector_base<const_float_*,_std::allocator<const_float_*>_>::~_Vector_base
            (&inputs.super__Vector_base<const_float_*,_std::allocator<const_float_*>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&output_pixel.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

void
LineCompositeTask::execute ()
{
    composite_line (
        _y, _start, _Data, *_names, *_pointers, *_total_sizes, *_num_sources);
}